

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::ComputeInvocationsSecondaryTestInstance::executeTest
          (TestStatus *__return_storage_ptr__,ComputeInvocationsSecondaryTestInstance *this,
          VkCommandPool *cmdPool,VkPipelineLayout pipelineLayout,VkDescriptorSet *descriptorSet,
          SharedPtr<vkt::Draw::Buffer> *buffer,VkDeviceSize bufferSizeBytes)

{
  VkCommandBuffer commandBuffer;
  VkCommandBuffer_s *pVVar1;
  RefData<vk::Handle<(vk::HandleType)14>_> data;
  RefData<vk::Handle<(vk::HandleType)18>_> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  RefData<vk::VkCommandBuffer_s_*> data_02;
  RefData<vk::Handle<(vk::HandleType)11>_> data_03;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  VkResult VVar6;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Buffer *pBVar7;
  size_type sVar8;
  Unique<vk::Handle<(vk::HandleType)14>_> *this_00;
  ProgramCollection<vk::ProgramBinary> *this_01;
  const_reference pvVar9;
  ProgramBinary *binary;
  reference this_02;
  RefBase<vk::Handle<(vk::HandleType)14>_> *this_03;
  Handle<(vk::HandleType)14> *pHVar10;
  Unique<vk::Handle<(vk::HandleType)18>_> *this_04;
  VkCommandBuffer_s **ppVVar11;
  Handle<(vk::HandleType)11> *pHVar12;
  reference this_05;
  RefBase<vk::Handle<(vk::HandleType)18>_> *this_06;
  Handle<(vk::HandleType)18> *pHVar13;
  SharedPtr<vkt::Draw::Buffer> local_3e0;
  deUint64 local_3d0;
  deUint64 local_3c8;
  ulong local_3c0;
  size_t parametersNdx_1;
  deUint64 local_3b0;
  deUint64 local_3a8;
  VkFramebuffer local_3a0;
  VkRenderPass local_398;
  SharedPtr<vkt::Draw::Buffer> local_390;
  Move<vk::Handle<(vk::HandleType)11>_> local_380;
  RefData<vk::Handle<(vk::HandleType)11>_> local_360;
  undefined1 local_340 [8];
  Unique<vk::Handle<(vk::HandleType)11>_> queryPool;
  Move<vk::VkCommandBuffer_s_*> local_318;
  RefData<vk::VkCommandBuffer_s_*> local_2f8;
  undefined1 local_2d8 [8];
  Unique<vk::VkCommandBuffer_s_*> secondaryCmdBuffer;
  Move<vk::VkCommandBuffer_s_*> local_2b0;
  RefData<vk::VkCommandBuffer_s_*> local_290;
  undefined1 local_270 [8];
  Unique<vk::VkCommandBuffer_s_*> primaryCmdBuffer;
  VkPipelineCache local_248;
  Move<vk::Handle<(vk::HandleType)18>_> local_240;
  RefData<vk::Handle<(vk::HandleType)18>_> local_220;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> local_200;
  undefined1 local_1f0 [8];
  VkComputePipelineCreateInfo pipelineCreateInfo;
  VkPipelineShaderStageCreateInfo pipelineShaderStageParams;
  Move<vk::Handle<(vk::HandleType)14>_> local_158;
  RefData<vk::Handle<(vk::HandleType)14>_> local_138;
  SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> local_108;
  ulong local_f8;
  size_t parametersNdx;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  pipeline;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  shaderModule;
  VkBufferMemoryBarrier computeFinishBarrier;
  VkBufferMemoryBarrier computeShaderWriteBarrier;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  SharedPtr<vkt::Draw::Buffer> *buffer_local;
  VkDescriptorSet *descriptorSet_local;
  VkCommandPool *cmdPool_local;
  ComputeInvocationsSecondaryTestInstance *this_local;
  VkPipelineLayout pipelineLayout_local;
  
  vk_00 = Context::getDeviceInterface
                    ((this->super_ComputeInvocationsTestInstance).super_StatisticQueryTestInstance.
                     super_TestInstance.m_context);
  device_00 = Context::getDevice((this->super_ComputeInvocationsTestInstance).
                                 super_StatisticQueryTestInstance.super_TestInstance.m_context);
  queue_00 = Context::getUniversalQueue
                       ((this->super_ComputeInvocationsTestInstance).
                        super_StatisticQueryTestInstance.super_TestInstance.m_context);
  computeFinishBarrier.size._0_4_ = 0x2c;
  pBVar7 = de::SharedPtr<vkt::Draw::Buffer>::operator->(buffer);
  Draw::Buffer::object(pBVar7);
  shaderModule.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x2c;
  computeFinishBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  computeFinishBarrier._4_4_ = 0;
  computeFinishBarrier.pNext._0_4_ = 0x40;
  computeFinishBarrier.pNext._4_4_ = 0x2000;
  computeFinishBarrier.srcAccessMask = 0xffffffff;
  computeFinishBarrier.dstAccessMask = 0xffffffff;
  pBVar7 = de::SharedPtr<vkt::Draw::Buffer>::operator->(buffer);
  computeFinishBarrier._24_8_ = Draw::Buffer::object(pBVar7);
  computeFinishBarrier.buffer.m_internal = 0;
  computeFinishBarrier.offset = bufferSizeBytes;
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
            *)&pipeline.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
            *)&parametersNdx);
  local_f8 = 0;
  while( true ) {
    uVar2 = local_f8;
    sVar8 = std::
            vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
            ::size((this->super_ComputeInvocationsTestInstance).m_parameters);
    if (sVar8 <= uVar2) break;
    this_00 = (Unique<vk::Handle<(vk::HandleType)14>_> *)operator_new(0x20);
    this_01 = Context::getBinaryCollection
                        ((this->super_ComputeInvocationsTestInstance).
                         super_StatisticQueryTestInstance.super_TestInstance.m_context);
    pvVar9 = std::
             vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
             ::operator[]((this->super_ComputeInvocationsTestInstance).m_parameters,local_f8);
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_01,&pvVar9->shaderName);
    ::vk::createShaderModule(&local_158,vk_00,device_00,binary,0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
    data.deleter.m_deviceIface._0_4_ = (int)local_138.deleter.m_deviceIface;
    data.object.m_internal = local_138.object.m_internal;
    data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_138.deleter.m_deviceIface >> 0x20);
    data.deleter.m_device = local_138.deleter.m_device;
    data.deleter.m_allocator._0_4_ = (int)local_138.deleter.m_allocator;
    data.deleter.m_allocator._4_4_ = (int)((ulong)local_138.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique(this_00,data);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::SharedPtr
              (&local_108,this_00);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                 *)&pipeline.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_108);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::~SharedPtr(&local_108);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_158);
    pipelineCreateInfo.basePipelineIndex = 0x12;
    this_02 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
              ::back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
                      *)&pipeline.
                         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    this_03 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::get(this_02)
               ->super_RefBase<vk::Handle<(vk::HandleType)14>_>;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::get(this_03);
    pipelineCreateInfo.stage._16_8_ = pHVar10->m_internal;
    local_1f0._0_4_ = VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO;
    pipelineCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    pipelineCreateInfo._4_4_ = 0;
    pipelineCreateInfo.pNext._0_4_ = 0;
    pipelineCreateInfo._20_4_ = pipelineCreateInfo._92_4_;
    pipelineCreateInfo.flags = pipelineCreateInfo.basePipelineIndex;
    pipelineCreateInfo.stage.pNext = (void *)0x2000000000;
    pipelineCreateInfo.stage.module.m_internal = (long)"pre_main" + 4;
    pipelineCreateInfo.stage.pName = (char *)0x0;
    pipelineCreateInfo.stage.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    pipelineCreateInfo.stage._4_4_ = 0;
    pipelineCreateInfo.stage.pSpecializationInfo = (VkSpecializationInfo *)pipelineLayout.m_internal
    ;
    ::vk::Handle<(vk::HandleType)18>::Handle
              ((Handle<(vk::HandleType)18> *)&pipelineCreateInfo.layout,0);
    pipelineCreateInfo.basePipelineHandle.m_internal._0_4_ = 0;
    this_04 = (Unique<vk::Handle<(vk::HandleType)18>_> *)operator_new(0x20);
    primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._7_1_ =
         1;
    ::vk::Handle<(vk::HandleType)15>::Handle(&local_248,0);
    ::vk::createComputePipeline
              (&local_240,vk_00,device_00,local_248,(VkComputePipelineCreateInfo *)local_1f0,
               (VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_220,(Move *)&local_240);
    data_00.deleter.m_deviceIface._0_4_ = (int)local_220.deleter.m_deviceIface;
    data_00.object.m_internal = local_220.object.m_internal;
    data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_220.deleter.m_deviceIface >> 0x20);
    data_00.deleter.m_device = local_220.deleter.m_device;
    data_00.deleter.m_allocator._0_4_ = (int)local_220.deleter.m_allocator;
    data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_220.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique(this_04,data_00);
    primaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal._7_1_ =
         0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::SharedPtr
              (&local_200,this_04);
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                 *)&parametersNdx,&local_200);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::~SharedPtr(&local_200);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_240);
    local_f8 = local_f8 + 1;
  }
  secondaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool =
       (VkCommandPool)cmdPool->m_internal;
  ::vk::allocateCommandBuffer
            (&local_2b0,vk_00,device_00,
             secondaryCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_290,(Move *)&local_2b0);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_290.deleter.m_deviceIface;
  data_01.object = local_290.object;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_290.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_290.deleter.m_device;
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_290.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_290.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_270,data_01);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_2b0);
  queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)cmdPool->m_internal;
  ::vk::allocateCommandBuffer
            (&local_318,vk_00,device_00,
             (VkCommandPool)
             queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator,
             VK_COMMAND_BUFFER_LEVEL_SECONDARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2f8,(Move *)&local_318);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_2f8.deleter.m_deviceIface;
  data_02.object = local_2f8.object;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2f8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_2f8.deleter.m_device;
  data_02.deleter.m_pool.m_internal._0_4_ = (int)local_2f8.deleter.m_pool.m_internal;
  data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_2f8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_2d8,data_02);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_318);
  makeQueryPool(&local_380,vk_00,device_00,0x400);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_360,(Move *)&local_380);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_360.deleter.m_deviceIface;
  data_03.object.m_internal = local_360.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_360.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device = local_360.deleter.m_device;
  data_03.deleter.m_allocator._0_4_ = (int)local_360.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_360.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_340,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::~Move(&local_380);
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr(&local_390,buffer);
  clearBuffer(vk_00,device_00,&local_390,bufferSizeBytes);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&local_390);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2d8);
  commandBuffer = *ppVVar11;
  ::vk::Handle<(vk::HandleType)17>::Handle(&local_398,0);
  ::vk::Handle<(vk::HandleType)23>::Handle(&local_3a0,0);
  beginSecondaryCommandBuffer(vk_00,commandBuffer,0x400,local_398,local_3a0,1);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2d8);
  local_3a8 = pipelineLayout.m_internal;
  (*vk_00->_vptr_DeviceInterface[0x56])
            (vk_00,*ppVVar11,1,pipelineLayout.m_internal,0,1,descriptorSet,0,0);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2d8);
  pVVar1 = *ppVVar11;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_340);
  local_3b0 = pHVar12->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x70])(vk_00,pVVar1,local_3b0,0,1);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2d8);
  pVVar1 = *ppVVar11;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_340);
  parametersNdx_1 = pHVar12->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x6e])(vk_00,pVVar1,parametersNdx_1,0);
  local_3c0 = 0;
  while( true ) {
    uVar2 = local_3c0;
    sVar8 = std::
            vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
            ::size((this->super_ComputeInvocationsTestInstance).m_parameters);
    if (sVar8 <= uVar2) break;
    ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_2d8);
    pVVar1 = *ppVVar11;
    this_05 = std::
              vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
              ::operator[]((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                            *)&parametersNdx,local_3c0);
    this_06 = &de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::get(this_05)
               ->super_RefBase<vk::Handle<(vk::HandleType)18>_>;
    pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::get(this_06);
    local_3c8 = pHVar13->m_internal;
    (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar1,1,local_3c8);
    ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_2d8);
    pVVar1 = *ppVVar11;
    pvVar9 = std::
             vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
             ::operator[]((this->super_ComputeInvocationsTestInstance).m_parameters,local_3c0);
    uVar3 = tcu::Vector<unsigned_int,_3>::x(&pvVar9->groupSize);
    pvVar9 = std::
             vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
             ::operator[]((this->super_ComputeInvocationsTestInstance).m_parameters,local_3c0);
    uVar4 = tcu::Vector<unsigned_int,_3>::y(&pvVar9->groupSize);
    pvVar9 = std::
             vector<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute,_std::allocator<vkt::QueryPool::(anonymous_namespace)::ComputeInvocationsTestInstance::ParametersCompute>_>
             ::operator[]((this->super_ComputeInvocationsTestInstance).m_parameters,local_3c0);
    uVar5 = tcu::Vector<unsigned_int,_3>::z(&pvVar9->groupSize);
    (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,pVVar1,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5);
    ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_2d8);
    (*vk_00->_vptr_DeviceInterface[0x6d])
              (vk_00,*ppVVar11,0x800,0x800,0,0,0,1,&computeFinishBarrier.size,0,0);
    local_3c0 = local_3c0 + 1;
  }
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2d8);
  pVVar1 = *ppVVar11;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_340);
  local_3d0 = pHVar12->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x6f])(vk_00,pVVar1,local_3d0,0);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2d8);
  VVar6 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar11);
  ::vk::checkResult(VVar6,"vk.endCommandBuffer(*secondaryCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x206);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_270);
  beginCommandBuffer(vk_00,*ppVVar11);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_270);
  pVVar1 = *ppVVar11;
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_2d8);
  (*vk_00->_vptr_DeviceInterface[0x77])(vk_00,pVVar1,1,ppVVar11);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_270);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar11,0x800,0x4000,0,0,0,1,
             &shaderModule.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0,0);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_270);
  VVar6 = (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar11);
  ::vk::checkResult(VVar6,"vk.endCommandBuffer(*primaryCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x20e);
  ppVVar11 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_270);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar11);
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr(&local_3e0,buffer);
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_340);
  (*(this->super_ComputeInvocationsTestInstance).super_StatisticQueryTestInstance.super_TestInstance
    ._vptr_TestInstance[5])
            (__return_storage_ptr__,this,&local_3e0,bufferSizeBytes,pHVar12->m_internal);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr(&local_3e0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_340);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_2d8);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_270);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
             *)&parametersNdx);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
             *)&pipeline.
                super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus ComputeInvocationsSecondaryTestInstance::executeTest (const VkCommandPool&			cmdPool,
																	  const VkPipelineLayout		pipelineLayout,
																	  const VkDescriptorSet&		descriptorSet,
																	  const de::SharedPtr<Buffer>	buffer,
																	  const VkDeviceSize			bufferSizeBytes)
{
	typedef de::SharedPtr<Unique<VkShaderModule> >	VkShaderModuleSp;
	typedef de::SharedPtr<Unique<VkPipeline> >		VkPipelineSp;

	const DeviceInterface&					vk							= m_context.getDeviceInterface();
	const VkDevice							device						= m_context.getDevice();
	const VkQueue							queue						= m_context.getUniversalQueue();

	const VkBufferMemoryBarrier				computeShaderWriteBarrier	=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			destQueueFamilyIndex;
		buffer->object(),							// VkBuffer			buffer;
		0ull,										// VkDeviceSize		offset;
		bufferSizeBytes,							// VkDeviceSize		size;
	};

	const VkBufferMemoryBarrier				computeFinishBarrier		=
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_SHADER_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_HOST_READ_BIT,					// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			destQueueFamilyIndex;
		buffer->object(),							// VkBuffer			buffer;
		0ull,										// VkDeviceSize		offset;
		bufferSizeBytes,							// VkDeviceSize		size;
	};

	std::vector<VkShaderModuleSp>			shaderModule;
	std::vector<VkPipelineSp>				pipeline;
	for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
	{
		shaderModule.push_back(VkShaderModuleSp(new Unique<VkShaderModule>(createShaderModule(vk, device, m_context.getBinaryCollection().get(m_parameters[parametersNdx].shaderName), (VkShaderModuleCreateFlags)0u))));
		const VkPipelineShaderStageCreateInfo	pipelineShaderStageParams	=
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
			DE_NULL,												// const void*							pNext;
			0u,														// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_COMPUTE_BIT,							// VkShaderStageFlagBits				stage;
			shaderModule.back().get()->get(),						// VkShaderModule						module;
			"main",													// const char*							pName;
			DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
		};

		const VkComputePipelineCreateInfo		pipelineCreateInfo			=
		{
			VK_STRUCTURE_TYPE_COMPUTE_PIPELINE_CREATE_INFO,	// VkStructureType					sType;
			DE_NULL,										// const void*						pNext;
			0u,												// VkPipelineCreateFlags			flags;
			pipelineShaderStageParams,						// VkPipelineShaderStageCreateInfo	stage;
			pipelineLayout,									// VkPipelineLayout					layout;
			DE_NULL,										// VkPipeline						basePipelineHandle;
			0,												// deInt32							basePipelineIndex;
		};
		pipeline.push_back(VkPipelineSp(new Unique<VkPipeline>(createComputePipeline(vk, device, DE_NULL , &pipelineCreateInfo))));
	}

	const Unique<VkCommandBuffer>				primaryCmdBuffer			(allocateCommandBuffer(vk, device, cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const Unique<VkCommandBuffer>				secondaryCmdBuffer			(allocateCommandBuffer(vk, device, cmdPool, VK_COMMAND_BUFFER_LEVEL_SECONDARY));

	const Unique<VkQueryPool>					queryPool					(makeQueryPool(vk, device, VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT));

	clearBuffer(vk, device, buffer, bufferSizeBytes);
	beginSecondaryCommandBuffer(vk, *secondaryCmdBuffer, VK_QUERY_PIPELINE_STATISTIC_COMPUTE_SHADER_INVOCATIONS_BIT);
		vk.cmdBindDescriptorSets(*secondaryCmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipelineLayout, 0u, 1u, &descriptorSet, 0u, DE_NULL);
		vk.cmdResetQueryPool(*secondaryCmdBuffer, *queryPool, 0u, 1u);
		vk.cmdBeginQuery(*secondaryCmdBuffer, *queryPool, 0u, (VkQueryControlFlags)0u);
		for(size_t parametersNdx = 0; parametersNdx < m_parameters.size(); ++parametersNdx)
		{
				vk.cmdBindPipeline(*secondaryCmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, pipeline[parametersNdx].get()->get());
				vk.cmdDispatch(*secondaryCmdBuffer, m_parameters[parametersNdx].groupSize.x(), m_parameters[parametersNdx].groupSize.y(), m_parameters[parametersNdx].groupSize.z());

				vk.cmdPipelineBarrier(*secondaryCmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT,
					(VkDependencyFlags)0u, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, &computeShaderWriteBarrier, 0u, (const VkImageMemoryBarrier*)DE_NULL);
		}
		vk.cmdEndQuery(*secondaryCmdBuffer, *queryPool, 0u);
	VK_CHECK(vk.endCommandBuffer(*secondaryCmdBuffer));

	beginCommandBuffer(vk, *primaryCmdBuffer);
		vk.cmdExecuteCommands(*primaryCmdBuffer, 1u, &secondaryCmdBuffer.get());

		vk.cmdPipelineBarrier(*primaryCmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_HOST_BIT,
			(VkDependencyFlags)0u, 0u, (const VkMemoryBarrier*)DE_NULL, 1u, &computeFinishBarrier, 0u, (const VkImageMemoryBarrier*)DE_NULL);

	VK_CHECK(vk.endCommandBuffer(*primaryCmdBuffer));

	// Wait for completion
	submitCommandsAndWait(vk, device, queue, *primaryCmdBuffer);
	return checkResult(buffer, bufferSizeBytes, *queryPool);
}